

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bumpers.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ostream *poVar9;
  char *pcVar10;
  int baud;
  undefined4 local_1bc;
  RobotModel model;
  string port;
  Create robot;
  
  _model = create::RobotModel::CREATE_2;
  std::__cxx11::string::string((string *)&port,"/dev/ttyUSB0",(allocator *)&robot);
  pcVar10 = "Running driver for Create 2";
  if (1 < argc) {
    std::__cxx11::string::string((string *)&robot,argv[1],(allocator *)&local_1bc);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &robot,"create1");
    std::__cxx11::string::~string((string *)&robot);
    if (bVar1) {
      _model = create::RobotModel::CREATE_1;
      pcVar10 = "Running driver for Create 1";
    }
  }
  poVar9 = std::operator<<((ostream *)&std::cout,pcVar10);
  std::endl<char,std::char_traits<char>>(poVar9);
  create::Create::Create(&robot,1);
  cVar2 = create::Create::connect((string *)&robot,(int *)&port);
  if (cVar2 == '\0') {
    poVar9 = std::operator<<((ostream *)&std::cout,"Failed to connect to robot on port ");
    poVar9 = std::operator<<(poVar9,port._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar9);
    create::Create::~Create(&robot);
    std::__cxx11::string::~string((string *)&port);
    return 1;
  }
  poVar9 = std::operator<<((ostream *)&std::cout,"Connected to robot");
  std::endl<char,std::char_traits<char>>(poVar9);
  local_1bc = 3;
  create::Create::setMode((CreateMode *)&robot);
  uVar3 = 0;
  uVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  do {
    cVar2 = create::RobotModel::operator==(&model,(RobotModel *)&create::RobotModel::CREATE_2);
    if (cVar2 != '\0') {
      uVar3 = create::Create::getLightSignalLeft();
      uVar4 = create::Create::getLightSignalFrontLeft();
      uVar5 = create::Create::getLightSignalCenterLeft();
      uVar6 = create::Create::getLightSignalCenterRight();
      uVar7 = create::Create::getLightSignalFrontRight();
      uVar8 = create::Create::getLightSignalRight();
      create::Create::isLightBumperLeft();
      create::Create::isLightBumperFrontLeft();
      create::Create::isLightBumperCenterLeft();
      create::Create::isLightBumperCenterRight();
      create::Create::isLightBumperFrontRight();
      create::Create::isLightBumperRight();
    }
    create::Create::isLeftBumper();
    create::Create::isRightBumper();
    poVar9 = std::operator<<((ostream *)&std::cout,"[ ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar3);
    poVar9 = std::operator<<(poVar9," , ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar4);
    poVar9 = std::operator<<(poVar9," , ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar5);
    poVar9 = std::operator<<(poVar9," , ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar6);
    poVar9 = std::operator<<(poVar9," , ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar7);
    poVar9 = std::operator<<(poVar9," , ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar8);
    poVar9 = std::operator<<(poVar9," ]");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"[ ");
    poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
    poVar9 = std::operator<<(poVar9," , ");
    poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
    poVar9 = std::operator<<(poVar9," , ");
    poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
    poVar9 = std::operator<<(poVar9," , ");
    poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
    poVar9 = std::operator<<(poVar9," , ");
    poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
    poVar9 = std::operator<<(poVar9," , ");
    poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
    poVar9 = std::operator<<(poVar9," ]");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"[ ");
    poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
    poVar9 = std::operator<<(poVar9," , ");
    poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
    poVar9 = std::operator<<(poVar9," ]");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    usleep(100000);
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  // Select robot. Assume Create 2 unless argument says otherwise
  create::RobotModel model = create::RobotModel::CREATE_2;
  std::string port = "/dev/ttyUSB0";
  int baud = 115200;
  if (argc > 1 && std::string(argv[1]) == "create1") {
    model = create::RobotModel::CREATE_1;
    baud = 57600;
    std::cout << "Running driver for Create 1" << std::endl;
  }
  else {
    std::cout << "Running driver for Create 2" << std::endl;
  }

  // Construct robot object
  create::Create robot(model);

  // Connect to robot
  if (robot.connect(port, baud))
    std::cout << "Connected to robot" << std::endl;
  else {
    std::cout << "Failed to connect to robot on port " << port.c_str() << std::endl;
    return 1;
  }

  // Switch to Full mode
  robot.setMode(create::MODE_FULL);

  uint16_t light_signals[6] = {0, 0, 0, 0, 0, 0};
  bool light_bumpers[6] = {false, false, false, false, false, false};
  bool contact_bumpers[2] = {false, false};

  while (true) {
    // Get light sensor data (only available for Create 2 or later robots)
    if (model == create::RobotModel::CREATE_2) {
      // Get raw light signal values
      light_signals[0] = robot.getLightSignalLeft();
      light_signals[1] = robot.getLightSignalFrontLeft();
      light_signals[2] = robot.getLightSignalCenterLeft();
      light_signals[3] = robot.getLightSignalCenterRight();
      light_signals[4] = robot.getLightSignalFrontRight();
      light_signals[5] = robot.getLightSignalRight();

      // Get obstacle data from light sensors (true/false)
      light_bumpers[0] = robot.isLightBumperLeft();
      light_bumpers[1] = robot.isLightBumperFrontLeft();
      light_bumpers[2] = robot.isLightBumperCenterLeft();
      light_bumpers[3] = robot.isLightBumperCenterRight();
      light_bumpers[4] = robot.isLightBumperFrontRight();
      light_bumpers[5] = robot.isLightBumperRight();
    }

    // Get state of bumpers
    contact_bumpers[0] = robot.isLeftBumper();
    contact_bumpers[1] = robot.isRightBumper();

    // Print signals from left to right
    std::cout << "[ " << light_signals[0] << " , "
                      << light_signals[1] << " , "
                      << light_signals[2] << " , "
                      << light_signals[3] << " , "
                      << light_signals[4] << " , "
                      << light_signals[5]
              << " ]" << std::endl;
    std::cout << "[ " << light_bumpers[0] << " , "
                      << light_bumpers[1] << " , "
                      << light_bumpers[2] << " , "
                      << light_bumpers[3] << " , "
                      << light_bumpers[4] << " , "
                      << light_bumpers[5]
              << " ]" << std::endl;
    std::cout << "[ " << contact_bumpers[0] << " , "
                      << contact_bumpers[1]
              << " ]" << std::endl;
    std::cout << std::endl;

    usleep(100000);  // 10 Hz
  }

  return 0;
}